

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O0

void __thiscall
wabt::intrusive_list<wabt::Expr>::push_back
          (intrusive_list<wabt::Expr> *this,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *node)

{
  pointer pEVar1;
  bool bVar2;
  Expr *node_p;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *node_local;
  intrusive_list<wabt::Expr> *this_local;
  
  pEVar1 = std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::operator->(node);
  bVar2 = false;
  if ((pEVar1->super_intrusive_list_base<wabt::Expr>).prev_ == (Expr *)0x0) {
    pEVar1 = std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::operator->(node);
    bVar2 = (pEVar1->super_intrusive_list_base<wabt::Expr>).next_ == (Expr *)0x0;
  }
  if (!bVar2) {
    __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                  ,0x1bd,
                  "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
                 );
  }
  pEVar1 = std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::release(node);
  if (this->last_ == (Expr *)0x0) {
    this->first_ = pEVar1;
  }
  else {
    (pEVar1->super_intrusive_list_base<wabt::Expr>).prev_ = this->last_;
    (this->last_->super_intrusive_list_base<wabt::Expr>).next_ = pEVar1;
  }
  this->last_ = pEVar1;
  this->size_ = this->size_ + 1;
  return;
}

Assistant:

inline void intrusive_list<T>::push_back(std::unique_ptr<T> node) {
  assert(node->prev_ == nullptr && node->next_ == nullptr);

  T* node_p = node.release();
  if (last_) {
    node_p->prev_ = last_;
    last_->next_ = node_p;
  } else {
    first_ = node_p;
  }
  last_ = node_p;
  size_++;
}